

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewEdgeCalculator.cpp
# Opt level: O3

void __thiscall
NewEdgeCalculator::iterateRemainingCovAp2
          (NewEdgeCalculator *this,AlignmentRecord *ap2,
          vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_> *cov_ap2,
          bool pe1,AlignmentRecord *ap1,int *tc,double *prob0,
          vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_> *cov_ap1,
          bool pe2,uint *pos2)

{
  pointer pmVar1;
  uint uVar2;
  uint uVar3;
  pointer pmVar4;
  pointer pmVar5;
  ulong uVar6;
  ulong uVar7;
  double dVar8;
  
  uVar7 = (ulong)*pos2;
  pmVar4 = (cov_ap2->
           super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pmVar5 = (cov_ap2->
           super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  uVar6 = ((long)pmVar5 - (long)pmVar4 >> 3) * -0x5555555555555555;
  if (uVar7 <= uVar6 && uVar6 - uVar7 != 0) {
    do {
      pmVar1 = pmVar4 + uVar7;
      if (pe1 && pe2) {
        uVar2 = AlignmentRecord::getStart2(ap2);
        uVar3 = AlignmentRecord::getEnd2(ap1);
        if ((uVar3 < uVar2) &&
           (uVar2 = pmVar1->ref, uVar3 = AlignmentRecord::getStart2(ap2), uVar3 <= uVar2)) {
          return;
        }
        dVar8 = (this->SIMPSON_MAP).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[pmVar1->ref];
        uVar7 = -(ulong)(dVar8 != 0.0);
        dVar8 = (double)(~uVar7 & 0xbfe34413509f79ff | (ulong)dVar8 & uVar7) + *prob0;
        uVar7 = (ulong)*pos2;
        pmVar4 = (cov_ap2->
                 super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pmVar5 = (cov_ap2->
                 super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        if (pmVar1->read !=
            (cov_ap1->
            super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>
            )._M_impl.super__Vector_impl_data._M_finish[-1].read) {
          return;
        }
        dVar8 = (this->SIMPSON_MAP).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[pmVar1->ref];
        uVar6 = -(ulong)(dVar8 != 0.0);
        dVar8 = (double)(~uVar6 & 0xbfe34413509f79ff | (ulong)dVar8 & uVar6) + *prob0;
      }
      *prob0 = dVar8;
      *pos2 = (int)uVar7 + 1;
      *tc = *tc + 1;
      uVar7 = (ulong)*pos2;
      uVar6 = ((long)pmVar5 - (long)pmVar4 >> 3) * -0x5555555555555555;
    } while (uVar7 <= uVar6 && uVar6 - uVar7 != 0);
  }
  return;
}

Assistant:

void NewEdgeCalculator::iterateRemainingCovAp2(const AlignmentRecord& ap2, const std::vector<AlignmentRecord::mapValue>& cov_ap2, bool pe1, const AlignmentRecord& ap1, int& tc, double& prob0, const std::vector<AlignmentRecord::mapValue>& cov_ap1, bool pe2, unsigned int& pos2) const
{
    while(pos2 < cov_ap2.size()){
        auto& v2 = cov_ap2[pos2];
        if(pe1 && pe2){
            if(ap2.getStart2() > ap1.getEnd2() && v2.ref >= ap2.getStart2()) break;
            else {
                calculateProb0(v2,prob0);
                pos2++;
                tc++;
            }
        }
       else if (v2.read == cov_ap1.back().read){
            calculateProb0(v2,prob0);
            pos2++;
            tc++;
        } else break;
    }
}